

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::block_is_pure(Compiler *this,SPIRBlock *block)

{
  bool bVar1;
  uint uVar2;
  Instruction *pIVar3;
  uint32_t *puVar4;
  SPIRFunction *func_00;
  SPIRType *pSVar5;
  SPIRExtension *pSVar6;
  SPIRType *type_1;
  GLSLstd450 op_450;
  uint32_t extension_set;
  SPIRType *type;
  uint32_t func;
  Op op;
  uint32_t *ops;
  Instruction *i;
  Instruction *__end1;
  Instruction *__begin1;
  SmallVector<spirv_cross::Instruction,_8UL> *__range1;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  if ((((*(int *)&(block->super_IVariant).field_0xc == 6) ||
       (*(int *)&(block->super_IVariant).field_0xc == 8)) ||
      (*(int *)&(block->super_IVariant).field_0xc == 7)) ||
     (*(int *)&(block->super_IVariant).field_0xc == 9)) {
    this_local._7_1_ = false;
  }
  else {
    __end1 = VectorView<spirv_cross::Instruction>::begin
                       (&(block->ops).super_VectorView<spirv_cross::Instruction>);
    pIVar3 = VectorView<spirv_cross::Instruction>::end
                       (&(block->ops).super_VectorView<spirv_cross::Instruction>);
    for (; __end1 != pIVar3; __end1 = __end1 + 1) {
      puVar4 = stream(this,__end1);
      uVar2 = (uint)__end1->op;
      if (uVar2 == 0xc) {
        pSVar6 = get<spirv_cross::SPIRExtension>(this,puVar4[2]);
        if (((*(int *)&(pSVar6->super_IVariant).field_0xc == 1) && ((puVar4[3] | 0x10) == 0x33)) &&
           (pSVar5 = expression_type(this,puVar4[5]), pSVar5->storage != Function)) {
          return false;
        }
      }
      else if (uVar2 == 0x39) {
        func_00 = get<spirv_cross::SPIRFunction>(this,puVar4[2]);
        bVar1 = function_is_pure(this,func_00);
        if (!bVar1) {
          return false;
        }
      }
      else {
        if (1 < uVar2 - 0x3e) {
          if (uVar2 == 99) {
            return false;
          }
          if (uVar2 - 0xda < 4) {
            return false;
          }
          if (uVar2 - 0xe0 < 2) {
            return false;
          }
          if (uVar2 - 0xe3 < 0x10) {
            return false;
          }
          if (uVar2 - 0x115d < 2) {
            return false;
          }
          if (uVar2 != 0x116a) {
            if (uVar2 - 0x1179 < 5) {
              return false;
            }
            if (uVar2 == 0x14af) {
              return false;
            }
            if (uVar2 - 0x14d6 < 4) {
              return false;
            }
            if (uVar2 == 0x14e0) {
              return false;
            }
            if (uVar2 == 0x1504) {
              return false;
            }
            goto LAB_00511187;
          }
        }
        pSVar5 = expression_type(this,*puVar4);
        if (pSVar5->storage != Function) {
          return false;
        }
      }
LAB_00511187:
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::block_is_pure(const SPIRBlock &block)
{
	// This is a global side effect of the function.
	if (block.terminator == SPIRBlock::Kill ||
	    block.terminator == SPIRBlock::TerminateRay ||
	    block.terminator == SPIRBlock::IgnoreIntersection ||
	    block.terminator == SPIRBlock::EmitMeshTasks)
		return false;

	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		case OpFunctionCall:
		{
			uint32_t func = ops[2];
			if (!function_is_pure(get<SPIRFunction>(func)))
				return false;
			break;
		}

		case OpCopyMemory:
		case OpStore:
		case OpCooperativeMatrixStoreKHR:
		{
			auto &type = expression_type(ops[0]);
			if (type.storage != StorageClassFunction)
				return false;
			break;
		}

		case OpImageWrite:
			return false;

		// Atomics are impure.
		case OpAtomicLoad:
		case OpAtomicStore:
		case OpAtomicExchange:
		case OpAtomicCompareExchange:
		case OpAtomicCompareExchangeWeak:
		case OpAtomicIIncrement:
		case OpAtomicIDecrement:
		case OpAtomicIAdd:
		case OpAtomicISub:
		case OpAtomicSMin:
		case OpAtomicUMin:
		case OpAtomicSMax:
		case OpAtomicUMax:
		case OpAtomicAnd:
		case OpAtomicOr:
		case OpAtomicXor:
			return false;

		// Geometry shader builtins modify global state.
		case OpEndPrimitive:
		case OpEmitStreamVertex:
		case OpEndStreamPrimitive:
		case OpEmitVertex:
			return false;

		// Mesh shader functions modify global state.
		// (EmitMeshTasks is a terminator).
		case OpSetMeshOutputsEXT:
			return false;

		// Barriers disallow any reordering, so we should treat blocks with barrier as writing.
		case OpControlBarrier:
		case OpMemoryBarrier:
			return false;

		// Ray tracing builtins are impure.
		case OpReportIntersectionKHR:
		case OpIgnoreIntersectionNV:
		case OpTerminateRayNV:
		case OpTraceNV:
		case OpTraceRayKHR:
		case OpExecuteCallableNV:
		case OpExecuteCallableKHR:
		case OpRayQueryInitializeKHR:
		case OpRayQueryTerminateKHR:
		case OpRayQueryGenerateIntersectionKHR:
		case OpRayQueryConfirmIntersectionKHR:
		case OpRayQueryProceedKHR:
			// There are various getters in ray query, but they are considered pure.
			return false;

			// OpExtInst is potentially impure depending on extension, but GLSL builtins are at least pure.

		case OpDemoteToHelperInvocationEXT:
			// This is a global side effect of the function.
			return false;

		case OpExtInst:
		{
			uint32_t extension_set = ops[2];
			if (get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
			{
				auto op_450 = static_cast<GLSLstd450>(ops[3]);
				switch (op_450)
				{
				case GLSLstd450Modf:
				case GLSLstd450Frexp:
				{
					auto &type = expression_type(ops[5]);
					if (type.storage != StorageClassFunction)
						return false;
					break;
				}

				default:
					break;
				}
			}
			break;
		}

		default:
			break;
		}
	}

	return true;
}